

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O3

void __thiscall bloaty::RollupOutput::RollupOutput(RollupOutput *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  (this->source_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->source_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->source_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"TOTAL","");
  (this->toplevel_row_).name._M_dataplus._M_p = (pointer)&(this->toplevel_row_).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->toplevel_row_,local_38,local_30 + (long)local_38);
  (this->toplevel_row_).filtered_size.vm = 0;
  (this->toplevel_row_).filtered_size.file = 0;
  (this->toplevel_row_).size.vm = 0;
  (this->toplevel_row_).size.file = 0;
  (this->toplevel_row_).other_count = 0;
  (this->toplevel_row_).old_size.vm = 0;
  (this->toplevel_row_).old_size.file = 0;
  (this->toplevel_row_).sorted_children.
  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->toplevel_row_).sorted_children.
  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->toplevel_row_).sorted_children.
  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->disassembly_)._M_dataplus._M_p = (pointer)&(this->disassembly_).field_2;
  (this->disassembly_)._M_string_length = 0;
  (this->disassembly_).field_2._M_local_buf[0] = '\0';
  this->diff_mode_ = false;
  return;
}

Assistant:

RollupOutput() : toplevel_row_("TOTAL") {}